

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.cpp
# Opt level: O3

void __thiscall
duckdb::ZSTDCompressionState::CompressString
          (ZSTDCompressionState *this,string_t *string,bool end_of_vector)

{
  size_t sVar1;
  uint uVar2;
  pointer pZVar3;
  size_t code;
  InvalidInputException *this_00;
  char *params;
  InternalException *this_01;
  long lVar4;
  undefined7 in_register_00000011;
  ZSTD_EndDirective endOp;
  ZSTD_inBuffer in_buffer;
  string local_68;
  ZSTD_inBuffer local_48;
  
  local_48.size = (size_t)(string->value).pointer.length;
  if (local_48.size < 0xd) {
    local_48.src = (void *)((long)&string->value + 4);
  }
  else {
    local_48.src = (string->value).pointer.ptr;
  }
  local_48.pos = 0;
  endOp = ZSTD_e_end;
  if (((int)CONCAT71(in_register_00000011,end_of_vector) != 0) ||
     (endOp = ZSTD_e_continue, local_48.size != 0)) {
    this->uncompressed_size = this->uncompressed_size + local_48.size;
    while( true ) {
      sVar1 = (this->out_buffer).pos;
      pZVar3 = unique_ptr<duckdb::ZSTDAnalyzeState,_std::default_delete<duckdb::ZSTDAnalyzeState>,_true>
               ::operator->(&this->analyze_state);
      code = duckdb_zstd::ZSTD_compressStream2(pZVar3->context,&this->out_buffer,&local_48,endOp);
      lVar4 = (this->out_buffer).pos - sVar1;
      this->compressed_size = this->compressed_size + lVar4;
      this->current_buffer_ptr = this->current_buffer_ptr + lVar4;
      uVar2 = duckdb_zstd::ZSTD_isError(code);
      if (uVar2 != 0) {
        this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_68,"ZSTD Compression failed: %s","");
        params = duckdb_zstd::ZSTD_getErrorName(code);
        InvalidInputException::InvalidInputException<char_const*>(this_00,&local_68,params);
        __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
      }
      if (code == 0) break;
      if ((this->out_buffer).pos != (this->out_buffer).size) {
        this_01 = (InternalException *)__cxa_allocate_exception(0x10);
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_68,
                   "Expected ZSTD_compressStream2 to fully utilize the current buffer, but pos is %d, while size is %d"
                   ,"");
        InternalException::InternalException<unsigned_long,unsigned_long>
                  (this_01,&local_68,(this->out_buffer).pos,(this->out_buffer).size);
        __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      NewPage(this,false);
    }
  }
  return;
}

Assistant:

void CompressString(const string_t &string, bool end_of_vector) {
		duckdb_zstd::ZSTD_inBuffer in_buffer = {/*data = */ string.GetData(),
		                                        /*length = */ size_t(string.GetSize()),
		                                        /*pos = */ 0};

		if (!end_of_vector && string.GetSize() == 0) {
			return;
		}
		uncompressed_size += string.GetSize();
		const auto end_mode = end_of_vector ? duckdb_zstd::ZSTD_e_end : duckdb_zstd::ZSTD_e_continue;

		size_t compress_result;
		while (true) {
			idx_t old_pos = out_buffer.pos;

			compress_result =
			    duckdb_zstd::ZSTD_compressStream2(analyze_state->context, &out_buffer, &in_buffer, end_mode);
			D_ASSERT(out_buffer.pos >= old_pos);
			auto diff = out_buffer.pos - old_pos;
			compressed_size += diff;
			current_buffer_ptr += diff;

			if (duckdb_zstd::ZSTD_isError(compress_result)) {
				throw InvalidInputException("ZSTD Compression failed: %s",
				                            duckdb_zstd::ZSTD_getErrorName(compress_result));
			}
			if (compress_result == 0) {
				// Finished
				break;
			}
			if (out_buffer.pos != out_buffer.size) {
				throw InternalException("Expected ZSTD_compressStream2 to fully utilize the current buffer, but pos is "
				                        "%d, while size is %d",
				                        out_buffer.pos, out_buffer.size);
			}
			NewPage();
		}
	}